

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::TextureLevelPyramid::TextureLevelPyramid(TextureLevelPyramid *this,TextureLevelPyramid *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int depth;
  const_reference other_00;
  reference pvVar4;
  TextureFormat *format;
  void *data;
  reference __dest;
  PixelBufferAccess local_68;
  ConstPixelBufferAccess *local_40;
  ConstPixelBufferAccess *srcLevel;
  allocator<tcu::PixelBufferAccess> local_2d;
  int levelNdx;
  allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_> local_19;
  TextureLevelPyramid *local_18;
  TextureLevelPyramid *other_local;
  TextureLevelPyramid *this_local;
  
  this->m_format = other->m_format;
  local_18 = other;
  other_local = this;
  iVar2 = getNumLevels(other);
  std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>::allocator(&local_19);
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::vector(&this->m_data,(long)iVar2,&local_19);
  std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>::~allocator(&local_19);
  iVar2 = getNumLevels(local_18);
  std::allocator<tcu::PixelBufferAccess>::allocator(&local_2d);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            (&this->m_access,(long)iVar2,&local_2d);
  std::allocator<tcu::PixelBufferAccess>::~allocator(&local_2d);
  srcLevel._4_4_ = 0;
  while( true ) {
    iVar2 = srcLevel._4_4_;
    iVar3 = getNumLevels(local_18);
    if (iVar3 <= iVar2) break;
    bVar1 = isLevelEmpty(local_18,srcLevel._4_4_);
    if (!bVar1) {
      local_40 = getLevel(local_18,srcLevel._4_4_);
      other_00 = std::
                 vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 ::operator[](&local_18->m_data,(long)srcLevel._4_4_);
      pvVar4 = std::
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ::operator[](&this->m_data,(long)srcLevel._4_4_);
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=(pvVar4,other_00);
      format = ConstPixelBufferAccess::getFormat(local_40);
      iVar2 = ConstPixelBufferAccess::getWidth(local_40);
      iVar3 = ConstPixelBufferAccess::getHeight(local_40);
      depth = ConstPixelBufferAccess::getDepth(local_40);
      pvVar4 = std::
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ::operator[](&this->m_data,(long)srcLevel._4_4_);
      data = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(pvVar4);
      PixelBufferAccess::PixelBufferAccess(&local_68,format,iVar2,iVar3,depth,data);
      __dest = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
               operator[](&this->m_access,(long)srcLevel._4_4_);
      memcpy(__dest,&local_68,0x28);
    }
    srcLevel._4_4_ = srcLevel._4_4_ + 1;
  }
  return;
}

Assistant:

TextureLevelPyramid::TextureLevelPyramid (const TextureLevelPyramid& other)
	: m_format	(other.m_format)
	, m_data	(other.getNumLevels())
	, m_access	(other.getNumLevels())
{
	for (int levelNdx = 0; levelNdx < other.getNumLevels(); levelNdx++)
	{
		if (!other.isLevelEmpty(levelNdx))
		{
			const tcu::ConstPixelBufferAccess& srcLevel = other.getLevel(levelNdx);

			m_data[levelNdx] = other.m_data[levelNdx];
			m_access[levelNdx] = PixelBufferAccess(srcLevel.getFormat(), srcLevel.getWidth(), srcLevel.getHeight(), srcLevel.getDepth(), m_data[levelNdx].getPtr());
		}
	}
}